

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lysp_type_enum_dup(ly_ctx *ctx,lysp_module *pmod,lysp_type_enum *orig_enm,lysp_type_enum *enm
                         )

{
  uint16_t *puVar1;
  lysp_ext_instance **pplVar2;
  lysp_qname *plVar3;
  lysp_qname *plVar4;
  lysp_ext_instance *plVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  long *plVar8;
  ulong uVar9;
  lysp_ext_instance *plVar10;
  size_t sVar11;
  lysp_ext_instance *plVar12;
  long lVar13;
  LY_ERR unaff_R13D;
  ulong uVar14;
  lysp_ext_instance *plVar15;
  bool bVar16;
  
  lydict_dup(ctx,orig_enm->name,&enm->name);
  lydict_dup(ctx,orig_enm->dsc,&enm->dsc);
  LVar6 = lydict_dup(ctx,orig_enm->ref,&enm->ref);
  enm->value = orig_enm->value;
  plVar3 = orig_enm->iffeatures;
  if (plVar3 != (lysp_qname *)0x0) {
    plVar4 = enm->iffeatures;
    if (plVar4 == (lysp_qname *)0x0) {
      plVar8 = (long *)calloc(1,*(long *)&plVar3[-1].flags * 0x18 + 8);
    }
    else {
      plVar8 = (long *)realloc(&plVar4[-1].flags,
                               (*(long *)&plVar3[-1].flags + *(long *)&plVar4[-1].flags) * 0x18 + 8)
      ;
    }
    if (plVar8 == (long *)0x0) {
      bVar16 = false;
      unaff_R13D = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
    }
    else {
      enm->iffeatures = (lysp_qname *)(plVar8 + 1);
      if (orig_enm->iffeatures == (lysp_qname *)0x0) {
        sVar11 = 0;
      }
      else {
        sVar11 = *(long *)&orig_enm->iffeatures[-1].flags * 0x18;
      }
      memset(plVar8 + *plVar8 * 3 + 1,0,sVar11);
      uVar14 = 0xffffffffffffffff;
      lVar13 = 0;
      do {
        plVar3 = orig_enm->iffeatures;
        if (plVar3 == (lysp_qname *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(ulong *)&plVar3[-1].flags;
        }
        uVar14 = uVar14 + 1;
        bVar16 = uVar9 <= uVar14;
        unaff_R13D = LY_EMEM;
        if (bVar16) break;
        plVar4 = enm->iffeatures;
        puVar1 = &plVar4[-1].flags;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        unaff_R13D = lysp_qname_dup(ctx,(lysp_qname *)((long)&plVar3->str + lVar13),
                                    (lysp_qname *)((long)&plVar4->str + lVar13));
        lVar13 = lVar13 + 0x18;
      } while (unaff_R13D == LY_SUCCESS);
    }
    if (!bVar16) {
      return unaff_R13D;
    }
  }
  plVar15 = orig_enm->exts;
  if (plVar15 != (lysp_ext_instance *)0x0) {
    plVar5 = enm->exts;
    if (plVar5 == (lysp_ext_instance *)0x0) {
      plVar12 = (lysp_ext_instance *)0x0;
      plVar8 = (long *)calloc(1,(long)plVar15[-1].exts * 0x70 | 8);
    }
    else {
      plVar12 = plVar5[-1].exts;
      plVar8 = (long *)realloc(&plVar5[-1].exts,
                               ((long)&(plVar5[-1].exts)->name + (long)&(plVar15[-1].exts)->name) *
                               0x70 | 8);
    }
    if (plVar8 == (long *)0x0) {
      bVar16 = false;
      unaff_R13D = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
    }
    else {
      enm->exts = (lysp_ext_instance *)(plVar8 + 1);
      if (orig_enm->exts == (lysp_ext_instance *)0x0) {
        sVar11 = 0;
      }
      else {
        sVar11 = (long)orig_enm->exts[-1].exts * 0x70;
      }
      memset(plVar8 + *plVar8 * 0xe + 1,0,sVar11);
      bVar16 = true;
    }
    if (bVar16) {
      plVar15 = (lysp_ext_instance *)0xffffffffffffffff;
      lVar13 = 0;
      do {
        plVar5 = orig_enm->exts;
        if (plVar5 == (lysp_ext_instance *)0x0) {
          plVar10 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar10 = plVar5[-1].exts;
        }
        plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
        bVar16 = plVar10 <= plVar15;
        LVar7 = unaff_R13D;
        if (bVar16) break;
        plVar10 = enm->exts;
        pplVar2 = &plVar10[-1].exts;
        *pplVar2 = (lysp_ext_instance *)((long)&(*pplVar2)->name + 1);
        LVar7 = lysp_ext_dup(ctx,pmod,enm,LY_STMT_ENUM,
                             (lysp_ext_instance *)((long)&plVar5->name + lVar13),
                             (lysp_ext_instance *)((long)&plVar10[(long)plVar12].name + lVar13));
        lVar13 = lVar13 + 0x70;
      } while (LVar7 == LY_SUCCESS);
    }
    else {
      bVar16 = false;
      LVar7 = unaff_R13D;
    }
    if (!bVar16) {
      return LVar7;
    }
  }
  enm->flags = orig_enm->flags;
  return LVar6;
}

Assistant:

static LY_ERR
lysp_type_enum_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, const struct lysp_type_enum *orig_enm,
        struct lysp_type_enum *enm)
{
    LY_ERR ret = LY_SUCCESS;

    DUP_STRING(ctx, orig_enm->name, enm->name, ret);
    DUP_STRING(ctx, orig_enm->dsc, enm->dsc, ret);
    DUP_STRING(ctx, orig_enm->ref, enm->ref, ret);
    enm->value = orig_enm->value;
    DUP_ARRAY(ctx, orig_enm->iffeatures, enm->iffeatures, lysp_qname_dup);
    DUP_EXTS(ctx, pmod, enm, LY_STMT_ENUM, orig_enm->exts, enm->exts, lysp_ext_dup);
    enm->flags = orig_enm->flags;

    return ret;
}